

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

PrecomputedTransactionData * PrecomputePSBTData(PartiallySignedTransaction *psbt)

{
  bool bVar1;
  bool bVar2;
  PrecomputedTransactionData *this;
  size_type sVar3;
  PrecomputedTransactionData *in_RDI;
  long in_FS_OFFSET;
  size_t idx;
  bool have_all_spent_outputs;
  CMutableTransaction *tx;
  PrecomputedTransactionData *txdata;
  vector<CTxOut,_std::allocator<CTxOut>_> utxos;
  PrecomputedTransactionData *in_stack_ffffffffffffff28;
  size_type in_stack_ffffffffffffff30;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  size_type in_stack_ffffffffffffff50;
  ulong uVar4;
  PrecomputedTransactionData *this_00;
  ulong local_80;
  vector<CTxOut,_std::allocator<CTxOut>_> local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  std::optional<CMutableTransaction>::operator*
            ((optional<CMutableTransaction> *)in_stack_ffffffffffffff28);
  bVar1 = true;
  this = (PrecomputedTransactionData *)
         std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff28);
  std::allocator<CTxOut>::allocator((allocator<CTxOut> *)in_stack_ffffffffffffff28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_RDI,in_stack_ffffffffffffff50,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::allocator<CTxOut>::~allocator((allocator<CTxOut> *)in_stack_ffffffffffffff28);
  local_80 = 0;
  while (uVar4 = local_80,
        sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                          ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff28),
        uVar4 < sVar3) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    bVar2 = PartiallySignedTransaction::GetInputUTXO
                      ((PartiallySignedTransaction *)this_00,(CTxOut *)in_RDI,(int)(uVar4 >> 0x20));
    if (!bVar2) {
      bVar1 = false;
    }
    local_80 = local_80 + 1;
  }
  PrecomputedTransactionData::PrecomputedTransactionData(in_stack_ffffffffffffff28);
  bVar2 = SUB81(uVar4 >> 0x38,0);
  if (bVar1) {
    PrecomputedTransactionData::Init<CMutableTransaction>
              (this,(CMutableTransaction *)this_00,(vector<CTxOut,_std::allocator<CTxOut>_> *)in_RDI
               ,bVar2);
  }
  else {
    local_48[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    in_stack_ffffffffffffff38 = local_48;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffff28);
    PrecomputedTransactionData::Init<CMutableTransaction>
              (this,(CMutableTransaction *)this_00,(vector<CTxOut,_std::allocator<CTxOut>_> *)in_RDI
               ,bVar2);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(in_stack_ffffffffffffff38);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

PrecomputedTransactionData PrecomputePSBTData(const PartiallySignedTransaction& psbt)
{
    const CMutableTransaction& tx = *psbt.tx;
    bool have_all_spent_outputs = true;
    std::vector<CTxOut> utxos(tx.vin.size());
    for (size_t idx = 0; idx < tx.vin.size(); ++idx) {
        if (!psbt.GetInputUTXO(utxos[idx], idx)) have_all_spent_outputs = false;
    }
    PrecomputedTransactionData txdata;
    if (have_all_spent_outputs) {
        txdata.Init(tx, std::move(utxos), true);
    } else {
        txdata.Init(tx, {}, true);
    }
    return txdata;
}